

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toymodule.cpp
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar1;
  UinputDevice *this;
  initializer_list<unsigned_int> __l;
  initializer_list<UinputDevice::PossibleEvent> __l_00;
  allocator_type local_be;
  allocator_type local_bd;
  uint local_bc;
  string local_b8;
  string local_98;
  vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  local_78;
  PossibleEvent local_58;
  vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_> local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Init!",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  this = (UinputDevice *)operator_new(4);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/dev/uinput","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"FunKeyMonkey Toy","");
  local_58.type = 1;
  local_bc = 0x25;
  __l._M_len = 1;
  __l._M_array = &local_bc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58.codes,__l,&local_bd);
  __l_00._M_len = 1;
  __l_00._M_array = &local_58;
  std::vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>::vector
            (&local_38,__l_00,&local_be);
  local_78.
  super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UinputDevice::UinputDevice(this,&local_98,3,&local_b8,1,1,1,&local_38,&local_78);
  out = this;
  if (local_78.
      super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>::~vector
            (&local_38);
  iVar1 = extraout_EAX;
  if (local_58.codes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.codes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
    iVar1 = extraout_EAX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
    iVar1 = extraout_EAX_02;
  }
  return iVar1;
}

Assistant:

void init(char const** argv, unsigned int argc)
{
  std::cout << "Init!" << std::endl;
  out = new UinputDevice("/dev/uinput", BUS_USB, "FunKeyMonkey Toy", 1, 1, 1, {
    { EV_KEY, { KEY_K } }
  });
}